

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_K.H
# Opt level: O0

void amrex::anon_unknown_1::mlndlap_scale_neumann_bc
               (Real s,Box *bx,Array4<double> *rhs,Box *nddom,GpuArray<amrex::LinOpBCType,_3U> *lobc
               ,GpuArray<amrex::LinOpBCType,_3U> *hibc)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  IntVect *pIVar4;
  long in_RCX;
  long lVar5;
  Box *in_RDX;
  long *in_RSI;
  Box *in_RDI;
  long in_R8;
  double in_XMM0_Qa;
  IntVect IVar6;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Box *bhi;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box *blo;
  int idim;
  IndexType typ;
  int sm;
  IntVect hi;
  IntVect low;
  IndexType typ_1;
  int bg;
  uint bitval;
  IntVect hi_1;
  IntVect low_1;
  int local_414;
  int local_410;
  int local_40c;
  Box *in_stack_fffffffffffffbf8;
  Box local_3cc;
  Box *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  undefined8 local_398;
  int local_390;
  undefined8 local_384;
  int local_37c;
  undefined8 local_378;
  int local_370;
  undefined8 local_368;
  int local_360;
  Box local_35c;
  Box *local_340;
  int local_334;
  long local_330;
  long local_328;
  Box *local_320;
  long *local_318;
  Box *local_310;
  double local_308;
  undefined8 local_300;
  int local_2f8;
  Box *local_2f0;
  int local_2e4;
  int iStack_2e0;
  int local_2dc;
  undefined8 local_2d8;
  int local_2d0;
  Box *local_2c8;
  int local_2bc;
  int iStack_2b8;
  int local_2b4;
  Box *local_2b0;
  int local_2a8;
  Box *local_2a0;
  int local_294;
  int iStack_290;
  int local_28c;
  undefined8 local_288;
  int local_280;
  Box *local_278;
  int local_270;
  int iStack_26c;
  int local_268;
  int local_264;
  long local_260;
  int local_254;
  long local_250;
  int local_244;
  long local_240;
  int local_234;
  long local_230;
  undefined4 local_224;
  IntVect *local_220;
  undefined4 local_214;
  IntVect *local_210;
  undefined4 local_204;
  IntVect *local_200;
  undefined4 local_1f4;
  IntVect *local_1f0;
  undefined4 local_1e4;
  IntVect *local_1e0;
  undefined4 local_1d4;
  IntVect *local_1d0;
  undefined4 local_1c4;
  Box *local_1c0;
  undefined4 local_1b4;
  Box *local_1b0;
  undefined4 local_1a4;
  Box *local_1a0;
  undefined4 local_194;
  Box *local_190;
  undefined4 local_184;
  Box *local_180;
  undefined4 local_174;
  Box *local_170;
  int local_164;
  int local_160;
  int local_15c;
  int local_14c;
  int local_148;
  int local_144;
  uint local_134;
  uint local_130;
  int local_12c;
  IntVect local_128;
  IntVect local_11c;
  int local_110;
  int local_10c;
  Box *local_108;
  int local_fc;
  IntVect *local_f8;
  int local_ec;
  uint *local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  IntVect *local_d0;
  int local_c8;
  int local_c4;
  IntVect *local_c0;
  uint local_b4;
  uint local_b0;
  int local_ac;
  int local_a8 [3];
  undefined8 local_98;
  int local_90;
  uint local_8c;
  IntVect local_88;
  IntVect local_78;
  int local_68;
  int local_64;
  Box *local_60;
  int local_54;
  IntVect *local_50;
  int local_44;
  undefined8 *local_40;
  int local_34;
  uint *local_30;
  int local_24;
  int local_20;
  int local_1c;
  IntVect *local_18;
  int local_10;
  int local_c;
  IntVect *local_8;
  
  local_334 = 0;
  local_330 = in_R8;
  local_328 = in_RCX;
  local_320 = in_RDX;
  local_318 = in_RSI;
  local_310 = in_RDI;
  local_308 = in_XMM0_Qa;
  do {
    if (2 < local_334) {
      return;
    }
    local_230 = local_328;
    local_234 = local_334;
    if (*(int *)(local_328 + (long)local_334 * 4) == 0x66) {
LAB_017598dd:
      local_108 = local_310;
      local_10c = local_334;
      local_110 = 1;
      pIVar4 = Box::smallEnd(local_310);
      local_11c.vect._0_8_ = *(undefined8 *)pIVar4->vect;
      local_11c.vect[2] = pIVar4->vect[2];
      pIVar4 = Box::bigEnd(local_108);
      uVar1 = *(undefined8 *)pIVar4->vect;
      iVar3 = pIVar4->vect[2];
      local_fc = local_10c;
      local_12c = local_11c.vect[local_10c];
      iVar2 = (local_12c - local_110) + 1;
      local_c4 = local_10c;
      local_11c.vect[local_10c] = iVar2;
      local_d4 = local_10c;
      local_128.vect[local_10c] = local_12c;
      local_128.vect._0_8_ = uVar1;
      local_128.vect[2] = iVar3;
      local_f8 = &local_11c;
      local_d8 = local_12c;
      local_d0 = &local_128;
      local_c8 = iVar2;
      local_c0 = &local_11c;
      local_134 = (uint)Box::ixType(local_108);
      local_e8 = &local_130;
      local_ec = local_10c;
      local_dc = local_10c;
      local_134 = 1 << ((byte)local_10c & 0x1f) | local_134;
      local_130 = local_134;
      Box::Box(&local_35c,&local_11c,&local_128,(IndexType)local_134);
      local_340 = &local_35c;
      iVar3 = Box::smallEnd(local_340,local_334);
      iVar2 = Box::smallEnd(local_320,local_334);
      if (iVar3 == iVar2) {
        local_2c8 = local_340;
        local_1a0 = local_340;
        local_1a4 = 0;
        local_2bc = (local_340->smallend).vect[0];
        local_1b0 = local_340;
        local_1b4 = 1;
        iStack_2b8 = (local_340->smallend).vect[1];
        local_378 = *(undefined8 *)(local_340->smallend).vect;
        local_1c0 = local_340;
        local_1c4 = 2;
        local_370 = (local_340->smallend).vect[2];
        local_278 = local_340;
        local_200 = &local_340->bigend;
        local_204 = 0;
        local_270 = local_200->vect[0];
        local_210 = &local_340->bigend;
        local_214 = 1;
        iStack_26c = (local_340->bigend).vect[1];
        local_398 = *(undefined8 *)local_200->vect;
        local_220 = &local_340->bigend;
        local_224 = 2;
        local_390 = (local_340->bigend).vect[2];
        for (local_39c = local_370; iVar3 = iStack_2b8, local_384 = local_398, local_37c = local_390
            , local_368 = local_378, local_360 = local_370, local_2d8 = local_378,
            local_2d0 = local_370, local_2b4 = local_370, local_288 = local_398,
            local_280 = local_390, local_268 = local_390, local_39c <= local_390;
            local_39c = local_39c + 1) {
          while (local_3a0 = iVar3, iVar3 = local_2bc, local_3a0 <= iStack_26c) {
            while (local_3a4 = iVar3, local_3a4 <= local_270) {
              local_144 = local_3a4;
              local_148 = local_3a0;
              local_14c = local_39c;
              lVar5 = (long)(local_3a4 - (int)local_318[4]) +
                      (long)(local_3a0 - *(int *)((long)local_318 + 0x24)) * local_318[1] +
                      (long)(local_39c - (int)local_318[5]) * local_318[2];
              *(double *)(*local_318 + lVar5 * 8) = local_308 * *(double *)(*local_318 + lVar5 * 8);
              iVar3 = local_3a4 + 1;
            }
            iVar3 = local_3a0 + 1;
          }
        }
      }
    }
    else {
      local_240 = local_328;
      local_244 = local_334;
      if (*(int *)(local_328 + (long)local_334 * 4) == 0x6a) goto LAB_017598dd;
    }
    local_250 = local_330;
    local_254 = local_334;
    if (*(int *)(local_330 + (long)local_334 * 4) == 0x66) {
LAB_01759eb9:
      local_60 = local_310;
      local_64 = local_334;
      local_68 = 1;
      pIVar4 = Box::smallEnd(local_310);
      local_78.vect[2] = pIVar4->vect[2];
      local_78.vect._0_8_ = *(undefined8 *)pIVar4->vect;
      pIVar4 = Box::bigEnd(local_60);
      local_88.vect[2] = pIVar4->vect[2];
      local_88.vect._0_8_ = *(undefined8 *)pIVar4->vect;
      IVar6 = Box::type(in_stack_fffffffffffffbf8);
      local_a8._0_8_ = IVar6.vect._0_8_;
      local_98._0_4_ = local_a8[0];
      local_98._4_4_ = local_a8[1];
      local_a8[2] = IVar6.vect[2];
      local_90 = local_a8[2];
      local_44 = local_64;
      local_8c = *(uint *)((long)&local_98 + (long)local_64 * 4);
      local_54 = local_64;
      local_ac = (local_88.vect[local_64] + 1) - (local_8c & 1);
      local_c = local_64;
      local_78.vect[local_64] = local_ac;
      iVar3 = local_ac + local_68 + -1;
      local_1c = local_64;
      local_88.vect[local_64] = iVar3;
      local_a8 = IVar6.vect;
      local_50 = &local_88;
      local_40 = &local_98;
      local_20 = iVar3;
      local_18 = &local_88;
      local_10 = local_ac;
      local_8 = &local_78;
      local_b4 = (uint)Box::ixType(local_60);
      local_30 = &local_b0;
      local_34 = local_64;
      local_24 = local_64;
      local_b4 = 1 << ((byte)local_64 & 0x1f) | local_b4;
      local_b0 = local_b4;
      Box::Box(&local_3cc,&local_78,&local_88,(IndexType)local_b4);
      local_3b0 = &local_3cc;
      iVar3 = Box::bigEnd(local_3b0,local_334);
      iVar2 = Box::bigEnd(local_320,local_334);
      if (iVar3 == iVar2) {
        local_2f0 = local_3b0;
        local_170 = local_3b0;
        local_174 = 0;
        local_2e4 = (local_3b0->smallend).vect[0];
        local_180 = local_3b0;
        local_184 = 1;
        iStack_2e0 = (local_3b0->smallend).vect[1];
        local_300 = *(undefined8 *)(local_3b0->smallend).vect;
        local_190 = local_3b0;
        local_194 = 2;
        local_2f8 = (local_3b0->smallend).vect[2];
        local_2a0 = local_3b0;
        local_1d0 = &local_3b0->bigend;
        local_1d4 = 0;
        local_294 = local_1d0->vect[0];
        local_1e0 = &local_3b0->bigend;
        local_1e4 = 1;
        iStack_290 = (local_3b0->bigend).vect[1];
        in_stack_fffffffffffffbf8 = *(Box **)local_1d0->vect;
        local_1f0 = &local_3b0->bigend;
        local_1f4 = 2;
        local_2a8 = (local_3b0->bigend).vect[2];
        for (local_40c = local_2f8; local_410 = iStack_2e0, local_2dc = local_2f8,
            local_2b0 = in_stack_fffffffffffffbf8, local_28c = local_2a8, local_40c <= local_2a8;
            local_40c = local_40c + 1) {
          for (; local_414 = local_2e4, local_410 <= iStack_290; local_410 = local_410 + 1) {
            for (; local_414 <= local_294; local_414 = local_414 + 1) {
              local_15c = local_414;
              local_160 = local_410;
              local_164 = local_40c;
              lVar5 = (long)(local_414 - (int)local_318[4]) +
                      (long)(local_410 - *(int *)((long)local_318 + 0x24)) * local_318[1] +
                      (long)(local_40c - (int)local_318[5]) * local_318[2];
              *(double *)(*local_318 + lVar5 * 8) = local_308 * *(double *)(*local_318 + lVar5 * 8);
            }
          }
        }
      }
    }
    else {
      local_260 = local_330;
      local_264 = local_334;
      if (*(int *)(local_330 + (long)local_334 * 4) == 0x6a) goto LAB_01759eb9;
    }
    local_334 = local_334 + 1;
  } while( true );
}

Assistant:

inline void
mlndlap_scale_neumann_bc (Real s, Box const& bx, Array4<Real> const& rhs, Box const& nddom,
                          GpuArray<LinOpBCType,AMREX_SPACEDIM> const& lobc,
                          GpuArray<LinOpBCType,AMREX_SPACEDIM> const& hibc) noexcept
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (lobc[idim] == LinOpBCType::Neumann || lobc[idim] == LinOpBCType::inflow) {
            Box const& blo = amrex::bdryLo(bx, idim);
            if (blo.smallEnd(idim) == nddom.smallEnd(idim)) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D (blo, i, j, k,
                {
                    rhs(i,j,k) *= s;
                });
            }
        }
        if (hibc[idim] == LinOpBCType::Neumann || hibc[idim] == LinOpBCType::inflow) {
            Box const& bhi = amrex::bdryHi(bx, idim);
            if (bhi.bigEnd(idim) == nddom.bigEnd(idim)) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bhi, i, j, k,
                {
                    rhs(i,j,k) *= s;
                });
            }
        }
    }
}